

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_17(QPDF *pdf,char *arg2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  QPDFObjectHandle QVar6;
  string contents;
  shared_ptr<Buffer> b;
  QPDFObjectHandle page_kids;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  long *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  long local_a8 [2];
  string local_98 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  long *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long local_78 [2];
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  QPDF::getRoot();
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/Pages","");
  QPDFObjectHandle::getKey(local_98);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/Kids","");
  QPDFObjectHandle::getKey(local_48);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  QPDFObjectHandle::getArrayItem((int)&local_b8);
  lVar3 = QPDFObjectHandle::getObjGen();
  QPDFObjectHandle::getArrayItem((int)&local_88);
  lVar4 = QPDFObjectHandle::getObjGen();
  if (lVar3 != lVar4) {
    __assert_fail("page_kids.getArrayItem(0).getObjGen() == page_kids.getArrayItem(1).getObjGen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x30a,"void test_17(QPDF &, const char *)");
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  plVar5 = (long *)QPDF::getAllPages();
  if (plVar5[1] - *plVar5 != 0x30) {
    __assert_fail("pages.size() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x30c,"void test_17(QPDF &, const char *)");
  }
  lVar3 = QPDFObjectHandle::getObjGen();
  if ((ulong)(plVar5[1] - *plVar5 >> 4) < 2) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_0011aa5f:
    __assert_fail("!(pages.at(0).getObjGen() == pages.at(1).getObjGen())",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x30d,"void test_17(QPDF &, const char *)");
  }
  lVar4 = QPDFObjectHandle::getObjGen();
  if (lVar3 == lVar4) goto LAB_0011aa5f;
  if (plVar5[1] == *plVar5) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*plVar5 + 8);
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/Contents","");
    QPDFObjectHandle::getKey(local_98);
    lVar4 = QPDFObjectHandle::getObjGen();
    lVar3 = *plVar5;
    if (1 < (ulong)(plVar5[1] - lVar3 >> 4)) {
      local_58 = *(undefined8 *)(lVar3 + 0x10);
      local_50 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x18);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_50->_M_use_count = local_50->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_50->_M_use_count = local_50->_M_use_count + 1;
        }
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/Contents","");
      QPDFObjectHandle::getKey(local_38);
      lVar3 = QPDFObjectHandle::getObjGen();
      if (lVar4 == lVar3) {
        if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
        }
        if (local_88 != local_78) {
          operator_delete(local_88,local_78[0] + 1);
        }
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        }
        if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8,local_a8[0] + 1);
        }
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        puVar2 = (undefined8 *)*plVar5;
        if ((undefined8 *)plVar5[1] == puVar2) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        else {
          local_68 = *puVar2;
          local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[1];
          if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_60->_M_use_count = local_60->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_60->_M_use_count = local_60->_M_use_count + 1;
            }
          }
          QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_68;
          QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)pdf;
          QPDF::removePage(QVar6);
          if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
          }
          if (plVar5[1] - *plVar5 == 0x20) {
            p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*plVar5 + 8);
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
              }
            }
            local_b8 = local_a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/Contents","");
            QPDFObjectHandle::getKey(local_98);
            QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&local_88);
            if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
            }
            if (local_b8 != local_a8) {
              operator_delete(local_b8,local_a8[0] + 1);
            }
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
            lVar3 = Buffer::getBuffer();
            lVar4 = Buffer::getSize();
            local_b8 = local_a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,lVar3,lVar4 + lVar3)
            ;
            lVar3 = std::__cxx11::string::find((char *)&local_b8,0x148b36,0);
            if (lVar3 != -1) {
              if (local_b8 != local_a8) {
                operator_delete(local_b8,local_a8[0] + 1);
              }
              if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
              }
              if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
              }
              return;
            }
            __assert_fail("contents.find(\"page 0\") != std::string::npos",
                          "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                          ,0x315,"void test_17(QPDF &, const char *)");
          }
        }
        __assert_fail("pages.size() == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x312,"void test_17(QPDF &, const char *)");
      }
      goto LAB_0011aaa3;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_0011aaa3:
  __assert_fail("QPDFObjectHandle(pages.at(0)).getKey(\"/Contents\").getObjGen() == QPDFObjectHandle(pages.at(1)).getKey(\"/Contents\").getObjGen()"
                ,"/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                ,0x310,"void test_17(QPDF &, const char *)");
}

Assistant:

static void
test_17(QPDF& pdf, char const* arg2)
{
    // The input file to this test case has a duplicated page.
    QPDFObjectHandle page_kids = pdf.getRoot().getKey("/Pages").getKey("/Kids");
    assert(page_kids.getArrayItem(0).getObjGen() == page_kids.getArrayItem(1).getObjGen());
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    assert(pages.size() == 3);
    assert(!(pages.at(0).getObjGen() == pages.at(1).getObjGen()));
    assert(
        QPDFObjectHandle(pages.at(0)).getKey("/Contents").getObjGen() ==
        QPDFObjectHandle(pages.at(1)).getKey("/Contents").getObjGen());
    pdf.removePage(pages.at(0));
    assert(pages.size() == 2);
    std::shared_ptr<Buffer> b = QPDFObjectHandle(pages.at(0)).getKey("/Contents").getStreamData();
    std::string contents = std::string(reinterpret_cast<char const*>(b->getBuffer()), b->getSize());
    assert(contents.find("page 0") != std::string::npos);
}